

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O3

string * __thiscall
chaiscript::exception::eval_error::startpos<std::shared_ptr<chaiscript::AST_Node_const>>
          (string *__return_storage_ptr__,eval_error *this,shared_ptr<const_chaiscript::AST_Node> *t
          )

{
  ostream *this_00;
  ostringstream oss;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  this_00 = (ostream *)std::ostream::operator<<(local_190,*(int *)(*(long *)this + 0x40));
  std::__ostream_insert<char,std::char_traits<char>>(this_00,", ",2);
  std::ostream::operator<<(this_00,*(int *)(*(long *)this + 0x44));
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

static std::string startpos(const T& t)
        {
          std::ostringstream oss;
          oss << t->start().line << ", " << t->start().column;
          return oss.str();
        }